

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_>::Stack
          (Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *this,
          Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *s)

{
  BottomFirstIterator it;
  pair<Kernel::TermList,_Kernel::RationalConstantType> *ppVar1;
  size_t sVar2;
  
  sVar2 = s->_capacity;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    sVar2 = 0;
    ppVar1 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)0x0;
  }
  else {
    ppVar1 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)Lib::alloc(sVar2 * 0x28);
    sVar2 = this->_capacity;
  }
  this->_stack = ppVar1;
  this->_cursor = ppVar1;
  this->_end = ppVar1 + sVar2;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::
  loadFromIterator<Lib::Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::BottomFirstIterator>
            ((Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>> *)this,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }